

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addDivide(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  double value;
  DdNode *G;
  DdNode *F;
  DdNode *res;
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)*f;
  pDVar1 = *g;
  if (dd_local == (DdManager *)dd->zero) {
    dd_local = (DdManager *)dd->zero;
  }
  else if (pDVar1 != dd->one) {
    if (((dd_local->sentinel).index == 0x7fffffff) && (pDVar1->index == 0x7fffffff)) {
      dd_local = (DdManager *)
                 cuddUniqueConst(dd,(dd_local->sentinel).type.value / (pDVar1->type).value);
    }
    else {
      dd_local = (DdManager *)0x0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addDivide(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *res;
    DdNode *F, *G;
    CUDD_VALUE_TYPE value;

    F = *f; G = *g;
    /* We would like to use F == G -> F/G == 1, but F and G may
    ** contain zeroes. */
    if (F == DD_ZERO(dd)) return(DD_ZERO(dd));
    if (G == DD_ONE(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        value = cuddV(F)/cuddV(G);
        res = cuddUniqueConst(dd,value);
        return(res);
    }
    return(NULL);

}